

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,function<void_(Pipeline_*)> *provider,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  FunctionProvider *__p;
  QPDFObjectHandle local_80;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> sdp;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_60;
  function<void_(Pipeline_*)> local_50;
  
  __p = (FunctionProvider *)operator_new(0x50);
  std::function<void_(Pipeline_*)>::function(&local_50,provider);
  StreamDataProvider::StreamDataProvider((StreamDataProvider *)__p,false);
  (__p->super_StreamDataProvider)._vptr_StreamDataProvider =
       (_func_int **)&PTR__FunctionProvider_002b04c8;
  std::function<void_(Pipeline_*)>::function(&__p->p1,&local_50);
  (__p->p2).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->p2)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__p->p2).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->p2).super__Function_base._M_functor + 8) = 0;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::
  shared_ptr<(anonymous_namespace)::FunctionProvider,void>(&sdp,__p);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  as_stream(&local_80,(typed)this);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &sdp.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>);
  ::qpdf::Stream::replaceStreamData
            ((Stream *)&local_80,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_60,
             filter,decode_parms);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sdp.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::function<void(Pipeline*)> provider,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto sdp = std::shared_ptr<StreamDataProvider>(new FunctionProvider(provider));
    as_stream(error).replaceStreamData(sdp, filter, decode_parms);
}